

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O0

void __thiscall
cfd::core::
JsonObjectVector<cfd::js::api::json::DecodeRawTransactionTxIn,_cfd::js::api::DecodeRawTransactionTxInStruct>
::DeserializeUniValue
          (JsonObjectVector<cfd::js::api::json::DecodeRawTransactionTxIn,_cfd::js::api::DecodeRawTransactionTxInStruct>
           *this,UniValue *value)

{
  bool bVar1;
  vector<UniValue,_std::allocator<UniValue>_> *this_00;
  undefined1 local_158 [8];
  DecodeRawTransactionTxIn local_value;
  UniValue *element;
  const_iterator __end3;
  const_iterator __begin3;
  vector<UniValue,_std::allocator<UniValue>_> *__range3;
  UniValue *value_local;
  JsonObjectVector<cfd::js::api::json::DecodeRawTransactionTxIn,_cfd::js::api::DecodeRawTransactionTxInStruct>
  *this_local;
  
  bVar1 = UniValue::isArray(value);
  if (bVar1) {
    std::
    vector<cfd::js::api::json::DecodeRawTransactionTxIn,_std::allocator<cfd::js::api::json::DecodeRawTransactionTxIn>_>
    ::clear(&(this->super_JsonVector<cfd::js::api::json::DecodeRawTransactionTxIn>).
             super_vector<cfd::js::api::json::DecodeRawTransactionTxIn,_std::allocator<cfd::js::api::json::DecodeRawTransactionTxIn>_>
           );
    this_00 = (vector<UniValue,_std::allocator<UniValue>_> *)UniValue::getValues();
    __end3 = std::vector<UniValue,_std::allocator<UniValue>_>::begin(this_00);
    element = (UniValue *)std::vector<UniValue,_std::allocator<UniValue>_>::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>
                                       *)&element), bVar1) {
      local_value._280_8_ =
           __gnu_cxx::
           __normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>::
           operator*(&__end3);
      bVar1 = UniValue::isObject((UniValue *)local_value._280_8_);
      if (bVar1) {
        js::api::json::DecodeRawTransactionTxIn::DecodeRawTransactionTxIn
                  ((DecodeRawTransactionTxIn *)local_158);
        JsonClassBase<cfd::js::api::json::DecodeRawTransactionTxIn>::DeserializeUniValue
                  ((JsonClassBase<cfd::js::api::json::DecodeRawTransactionTxIn> *)local_158,
                   (UniValue *)local_value._280_8_);
        std::
        vector<cfd::js::api::json::DecodeRawTransactionTxIn,_std::allocator<cfd::js::api::json::DecodeRawTransactionTxIn>_>
        ::push_back(&(this->super_JsonVector<cfd::js::api::json::DecodeRawTransactionTxIn>).
                     super_vector<cfd::js::api::json::DecodeRawTransactionTxIn,_std::allocator<cfd::js::api::json::DecodeRawTransactionTxIn>_>
                    ,(value_type *)local_158);
        js::api::json::DecodeRawTransactionTxIn::~DecodeRawTransactionTxIn
                  ((DecodeRawTransactionTxIn *)local_158);
      }
      __gnu_cxx::
      __normal_iterator<const_UniValue_*,_std::vector<UniValue,_std::allocator<UniValue>_>_>::
      operator++(&__end3);
    }
  }
  return;
}

Assistant:

virtual void DeserializeUniValue(const UniValue& value) {
    if (!value.isArray()) {
      return;
    }
    std::vector<TYPE>::clear();
    for (const auto& element : value.getValues()) {
      if (element.isObject()) {
        TYPE local_value;
        local_value.DeserializeUniValue(element);
        std::vector<TYPE>::push_back(local_value);
      }
    }
  }